

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

bool __thiscall
QAbstractItemViewPrivate::sendDelegateEvent
          (QAbstractItemViewPrivate *this,QModelIndex *index,QEvent *event)

{
  bool bVar1;
  QAbstractItemView *pQVar2;
  long *plVar3;
  long in_RDX;
  StateFlag other;
  undefined8 in_RSI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemDelegate *delegate;
  QAbstractItemView *q;
  QModelIndex buddy;
  QStyleOptionViewItem options;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  byte local_141;
  QAbstractItemView *in_stack_fffffffffffffec0;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 local_d8 [8];
  QFlags<QStyle::StateFlag> aQStack_d0 [2];
  undefined1 local_c8 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  local_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)in_RDI->model + 0x148))(&local_f0,in_RDI->model,in_RSI);
  memset(local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x805c19);
  (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x2f8))
            (pQVar2,local_d8);
  local_c8 = (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                         0x1e0))(pQVar2,&local_f0);
  QAbstractItemView::currentIndex(in_stack_fffffffffffffec0);
  bVar1 = ::operator==((QModelIndex *)in_RDI,
                       (QModelIndex *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8))
  ;
  other = State_None;
  if (bVar1) {
    other = State_HasFocus;
  }
  QFlags<QStyle::StateFlag>::operator|=(aQStack_d0,other);
  plVar3 = (long *)(**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.
                                          super_QWidget + 0x208))(pQVar2,in_RSI);
  local_141 = 0;
  if ((in_RDX != 0) && (local_141 = 0, plVar3 != (long *)0x0)) {
    local_141 = (**(code **)(*plVar3 + 0x98))(plVar3,in_RDX,in_RDI->model,local_d8,&local_f0);
  }
  QStyleOptionViewItem::~QStyleOptionViewItem((QStyleOptionViewItem *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_141 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemViewPrivate::sendDelegateEvent(const QModelIndex &index, QEvent *event) const
{
    Q_Q(const QAbstractItemView);
    QModelIndex buddy = model->buddy(index);
    QStyleOptionViewItem options;
    q->initViewItemOption(&options);
    options.rect = q->visualRect(buddy);
    options.state |= (buddy == q->currentIndex() ? QStyle::State_HasFocus : QStyle::State_None);
    QAbstractItemDelegate *delegate = q->itemDelegateForIndex(index);
    return (event && delegate && delegate->editorEvent(event, model, options, buddy));
}